

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineValidator.cpp
# Opt level: O2

Result * CoreML::validate(Result *__return_storage_ptr__,Model *spec,Pipeline *pipelineParams)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  int __val;
  mapped_type pFVar1;
  Rep *pRVar2;
  FeatureDescription *pFVar3;
  bool bVar4;
  undefined1 *puVar5;
  mapped_type *ppFVar6;
  iterator iVar7;
  Type *pTVar8;
  Type *pTVar9;
  iterator iVar10;
  void **ppvVar11;
  int iVar12;
  int iVar13;
  Rep *pRVar14;
  string *this;
  Model *pMVar15;
  long lVar16;
  int index;
  string modelName;
  Model model;
  undefined1 local_138 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  Pipeline *local_f8;
  RepeatedPtrFieldBase *local_f0;
  Model *local_e8;
  undefined1 local_e0 [40];
  string local_b8;
  Model *local_98;
  Rep *local_90;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>_>
  typeTable;
  string local_50;
  
  __val = (pipelineParams->models_).super_RepeatedPtrFieldBase.current_size_;
  local_f8 = pipelineParams;
  if (__val == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&typeTable,"Pipeline must contain one or more models.",
               (allocator<char> *)&model);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&typeTable);
    std::__cxx11::string::~string((string *)&typeTable);
    return __return_storage_ptr__;
  }
  typeTable._M_h._M_buckets = &typeTable._M_h._M_single_bucket;
  typeTable._M_h._M_bucket_count = 1;
  typeTable._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  typeTable._M_h._M_element_count = 0;
  typeTable._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  typeTable._M_h._M_rehash_policy._M_next_resize = 0;
  typeTable._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar5 = (undefined1 *)spec->description_;
  if ((ModelDescription *)puVar5 == (ModelDescription *)0x0) {
    puVar5 = Specification::_ModelDescription_default_instance_;
  }
  pRVar14 = (((ModelDescription *)puVar5)->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar11 = pRVar14->elements;
  if (pRVar14 == (Rep *)0x0) {
    ppvVar11 = (void **)0x0;
  }
  iVar13 = (((ModelDescription *)puVar5)->input_).super_RepeatedPtrFieldBase.current_size_;
  for (lVar16 = 0; (long)iVar13 * 8 != lVar16; lVar16 = lVar16 + 8) {
    pFVar1 = *(mapped_type *)((long)ppvVar11 + lVar16);
    ppFVar6 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&typeTable,
                           (key_type *)
                           ((ulong)(pFVar1->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    *ppFVar6 = pFVar1;
  }
  local_f0 = &(local_f8->models_).super_RepeatedPtrFieldBase;
  pRVar14 = (local_f8->models_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar14 != (Rep *)0x0) {
    pRVar14 = (Rep *)pRVar14->elements;
  }
  local_90 = (Rep *)(pRVar14->elements +
                    (long)(local_f8->models_).super_RepeatedPtrFieldBase.current_size_ + -1);
  local_e0._32_8_ = &__return_storage_ptr__->m_message;
  local_98 = spec;
  for (; pMVar15 = local_98, pRVar14 != local_90; pRVar14 = (Rep *)pRVar14->elements) {
    local_e8 = *(Model **)pRVar14;
    puVar5 = (undefined1 *)local_e8->description_;
    if ((ModelDescription *)puVar5 == (ModelDescription *)0x0) {
      puVar5 = Specification::_ModelDescription_default_instance_;
    }
    pRVar2 = (((ModelDescription *)puVar5)->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar11 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      ppvVar11 = (void **)0x0;
    }
    iVar13 = (((ModelDescription *)puVar5)->input_).super_RepeatedPtrFieldBase.current_size_;
    lVar16 = 0;
    while (pMVar15 = local_e8, (long)iVar13 * 8 != lVar16) {
      pFVar3 = *(FeatureDescription **)((long)ppvVar11 + lVar16);
      iVar7 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&typeTable._M_h,
                     (key_type *)((ulong)(pFVar3->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      if (iVar7.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,"Pipeline: the input \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(pFVar3->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_138 + 0x20),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,"\' of model \'");
        puVar5 = (undefined1 *)local_e8->description_;
        if ((ModelDescription *)puVar5 == (ModelDescription *)0x0) {
          puVar5 = Specification::_ModelDescription_default_instance_;
        }
        Specification::ModelDescription::GetTypeName_abi_cxx11_
                  ((string *)local_e0,(ModelDescription *)puVar5);
        std::operator+(&modelName,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_138 + 0x20),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&model,
                       &modelName,"\' does not present in pipeline input or previous model.");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&model);
        std::__cxx11::string::~string((string *)&model);
        std::__cxx11::string::~string((string *)&modelName);
        std::__cxx11::string::~string((string *)local_e0);
        std::__cxx11::string::~string((string *)(local_138 + 0x20));
        pMVar15 = (Model *)local_138;
        goto LAB_00284f8d;
      }
      bVar4 = Specification::isEquivalent
                        (pFVar3,*(FeatureDescription **)
                                 ((long)iVar7.
                                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
                                        ._M_cur + 0x28));
      lVar16 = lVar16 + 8;
      if (!bVar4) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                       ,"Pipeline: the input \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(pFVar3->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                       ,"\' of model \'");
        puVar5 = (undefined1 *)local_e8->description_;
        if ((ModelDescription *)puVar5 == (ModelDescription *)0x0) {
          puVar5 = Specification::_ModelDescription_default_instance_;
        }
        Specification::ModelDescription::GetTypeName_abi_cxx11_
                  ((string *)(local_e0 + 0x28),(ModelDescription *)puVar5);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_138 + 0x20),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_e0 + 0x28));
        std::operator+(&modelName,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_138 + 0x20),
                       "\' does not match the type previously specified by the pipeline input or the output of a previous model."
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&model,
                       &modelName,
                       " For the second case, make sure the input and previous model\'s output has the matching name and shapes."
                      );
        Result::Result(__return_storage_ptr__,TYPE_MISMATCH,(string *)&model);
        std::__cxx11::string::~string((string *)&model);
        std::__cxx11::string::~string((string *)&modelName);
        std::__cxx11::string::~string((string *)(local_138 + 0x20));
        this = (string *)(local_e0 + 0x28);
        goto LAB_00284f76;
      }
    }
    Model::validate(__return_storage_ptr__,local_e8);
    bVar4 = Result::good(__return_storage_ptr__);
    if (!bVar4) goto LAB_00284f92;
    puVar5 = (undefined1 *)pMVar15->description_;
    if ((ModelDescription *)puVar5 == (ModelDescription *)0x0) {
      puVar5 = Specification::_ModelDescription_default_instance_;
    }
    pRVar2 = (((ModelDescription *)puVar5)->output_).super_RepeatedPtrFieldBase.rep_;
    ppvVar11 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      ppvVar11 = (void **)0x0;
    }
    iVar13 = (((ModelDescription *)puVar5)->output_).super_RepeatedPtrFieldBase.current_size_;
    for (lVar16 = 0; (long)iVar13 * 8 != lVar16; lVar16 = lVar16 + 8) {
      pFVar1 = *(mapped_type *)((long)ppvVar11 + lVar16);
      ppFVar6 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&typeTable._M_h,
                             (key_type *)
                             ((ulong)(pFVar1->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      *ppFVar6 = pFVar1;
    }
    std::__cxx11::string::~string((string *)local_e0._32_8_);
  }
  puVar5 = (undefined1 *)local_98->description_;
  if ((ModelDescription *)puVar5 == (ModelDescription *)0x0) {
    puVar5 = Specification::_ModelDescription_default_instance_;
  }
  pRVar14 = (((ModelDescription *)puVar5)->output_).super_RepeatedPtrFieldBase.rep_;
  ppvVar11 = pRVar14->elements;
  if (pRVar14 == (Rep *)0x0) {
    ppvVar11 = (void **)0x0;
  }
  iVar13 = (((ModelDescription *)puVar5)->output_).super_RepeatedPtrFieldBase.current_size_;
  lVar16 = 0;
  do {
    if ((long)iVar13 * 8 == lVar16) {
      if (pMVar15->isupdatable_ == false) {
        iVar12 = 0;
        iVar13 = 0;
        if (0 < __val) {
          iVar13 = __val;
        }
        goto LAB_00285141;
      }
      iVar12 = __val + -1;
      index = 0;
      iVar13 = 0;
      if (0 < iVar12) {
        iVar13 = iVar12;
      }
      goto LAB_00285094;
    }
    pFVar3 = *(FeatureDescription **)((long)ppvVar11 + lVar16);
    iVar7 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&typeTable._M_h,
                   (key_type *)((ulong)(pFVar3->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    if (iVar7.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::operator+(&modelName,"Pipeline output \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(pFVar3->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&model,
                     &modelName,"\' not present in pipeline input or a contained model.");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&model);
      goto LAB_00285113;
    }
    bVar4 = Specification::isEquivalent
                      (pFVar3,*(FeatureDescription **)
                               ((long)iVar7.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
                                      ._M_cur + 0x28));
    lVar16 = lVar16 + 8;
  } while (bVar4);
  std::operator+(&modelName,"Type of pipeline output \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)(pFVar3->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&model,
                 &modelName,"\' does not match type produced in pipeline input.");
  Result::Result(__return_storage_ptr__,TYPE_MISMATCH,(string *)&model);
LAB_00285113:
  std::__cxx11::string::~string((string *)&model);
  pMVar15 = (Model *)&modelName;
LAB_00284f8d:
  std::__cxx11::string::~string((string *)pMVar15);
LAB_00284f92:
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&typeTable._M_h);
  return __return_storage_ptr__;
LAB_00285094:
  if (iVar13 == index) goto LAB_00285176;
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                     (local_f0,index);
  Specification::Model::Model(&model,pTVar8);
  if (model.isupdatable_ == true) {
    std::__cxx11::to_string((string *)local_138,index);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_138 + 0x20),
                   "Only the last model in the pipeline can be updatable. Model at position \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138);
    std::operator+(&modelName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_138 + 0x20),"\' is marked as updatable.");
    Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&modelName);
    goto LAB_002853a9;
  }
  Specification::Model::~Model(&model);
  index = index + 1;
  goto LAB_00285094;
LAB_00285176:
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                     (local_f0,iVar12);
  if (pTVar8->isupdatable_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&model,
               "Last model in an updatable pipeline model should be marked as updatable.",
               (allocator<char> *)&modelName);
    Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,(string *)&model);
    pMVar15 = &model;
  }
  else {
LAB_0028518f:
    iVar13 = (local_f8->names_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar13 < 1) {
LAB_002854d2:
      Result::Result(__return_storage_ptr__);
      goto LAB_00284f92;
    }
    if (iVar13 == __val) {
      model._24_8_ = &model.super_MessageLite._internal_metadata_;
      model.super_MessageLite._internal_metadata_.ptr_._0_4_ = 0;
      model.description_ = (ModelDescription *)0x0;
      model._cached_size_.size_.super___atomic_base<int>._M_i = (atomic<int>)0x0;
      model._oneof_case_[0] = 0;
      local_f8 = (Pipeline *)&local_f8->names_;
      iVar13 = 0;
      model.Type_ = (TypeUnion)model._24_8_;
      do {
        if (__val == iVar13) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&model);
          goto LAB_002854d2;
        }
        pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           ((RepeatedPtrFieldBase *)local_f8,iVar13);
        std::__cxx11::string::string((string *)&modelName,(string *)pTVar9);
        iVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&model,&modelName);
        if (iVar10._M_node == (_Base_ptr)&model.super_MessageLite._internal_metadata_) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&model,&modelName);
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_e0 + 0x28),"Pipeline model name \'",&modelName);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(local_e0 + 0x28),"\' at index \'");
          std::__cxx11::to_string(&local_50,iVar13);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e0,&local_50);
          __return_storage_ptr___00 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_138 + 0x20);
          std::operator+(__return_storage_ptr___00,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138," has already been used for previous models");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,__return_storage_ptr___00);
          std::__cxx11::string::~string((string *)__return_storage_ptr___00);
          std::__cxx11::string::~string((string *)local_138);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)local_e0);
          std::__cxx11::string::~string((string *)(local_e0 + 0x28));
        }
        std::__cxx11::string::~string((string *)&modelName);
        iVar13 = iVar13 + 1;
      } while (iVar10._M_node == (_Base_ptr)&model.super_MessageLite._internal_metadata_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&model);
      goto LAB_00284f92;
    }
    std::__cxx11::to_string((string *)local_e0,iVar13);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   "The number of pipeline model names \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_138 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   "\' doesn\'t match the number of models \'");
    std::__cxx11::to_string((string *)(local_e0 + 0x28),__val);
    std::operator+(&modelName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_138 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_e0 + 0x28));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&model,
                   &modelName,"\'");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&model);
    std::__cxx11::string::~string((string *)&model);
    std::__cxx11::string::~string((string *)&modelName);
    std::__cxx11::string::~string((string *)(local_e0 + 0x28));
    this = (string *)(local_138 + 0x20);
LAB_00284f76:
    std::__cxx11::string::~string(this);
    std::__cxx11::string::~string((string *)local_138);
    pMVar15 = (Model *)local_e0;
  }
  goto LAB_00284f8d;
LAB_00285141:
  if (iVar13 == iVar12) goto LAB_0028518f;
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                     (local_f0,iVar12);
  Specification::Model::Model(&model,pTVar8);
  if (model.isupdatable_ == true) {
    std::__cxx11::to_string((string *)local_138,iVar12);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_138 + 0x20),"Found an updatable model at \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138);
    std::operator+(&modelName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_138 + 0x20),"\' inside a non-updatable pipeline.");
    Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&modelName);
LAB_002853a9:
    std::__cxx11::string::~string((string *)&modelName);
    std::__cxx11::string::~string((string *)(local_138 + 0x20));
    std::__cxx11::string::~string((string *)local_138);
    Specification::Model::~Model(&model);
    goto LAB_00284f92;
  }
  Specification::Model::~Model(&model);
  iVar12 = iVar12 + 1;
  goto LAB_00285141;
}

Assistant:

static Result validate(const Specification::Model& spec, const Specification::Pipeline& pipelineParams) {
        const int nModels = pipelineParams.models_size();
        if (nModels == 0) {
            // empty chain is not allowed
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Pipeline must contain one or more models.");
        }

        // build a type table from the list of models
        std::unordered_map<std::string, const CoreML::Specification::FeatureDescription*> typeTable;

        // First, populate the type table with the given inputs from the pipeline
        for(const auto& input : spec.description().input() ) {
            typeTable[input.name()] = &input;
        }

        // iterate over models and check the types at each one, making sure they match up with previous versions.
        for (const auto& model : pipelineParams.models()) {
            const auto& inputs = model.description().input();

            // validate current transform against previously known valid state
            for (const CoreML::Specification::FeatureDescription& arg : inputs) {

                auto it = typeTable.find(arg.name());

                if(it == typeTable.end()) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  ("Pipeline: the input '" + arg.name() + "' of model '" + model.description().GetTypeName()
                                   + "' does not present in pipeline input or previous model."));
                }

                if(!CoreML::Specification::isEquivalent(arg, *(it->second))) {
                    return Result(ResultType::TYPE_MISMATCH,
                                  ("Pipeline: the input '" + arg.name() + "' of model '" + model.description().GetTypeName()
                                   + "' does not match the type previously specified by the pipeline input or the output of a previous model."
                                   + " For the second case, make sure the input and previous model's output has the matching name and shapes."));
                }
            }

            // validate the model itself and bail out if it's invalid
            Result r = Model::validate(model);
            if (!r.good()) { return r; }

            // Now add in the outputs of this model to the mix.
            const auto& outputs = model.description().output();
            for (const CoreML::Specification::FeatureDescription& arg : outputs) {
                typeTable[arg.name()] = &arg;
            }
        }

        // Finally, validate that the outputs of the pipeline model match what is outputted by the models.
        for(const auto& output : spec.description().output() ) {
            auto it = typeTable.find(output.name());

            if(it == typeTable.end()) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              ("Pipeline output '" + output.name() + "' not present in pipeline input or a contained model."));
            }

            if(!CoreML::Specification::isEquivalent(output, *(it->second))) {
                return Result(ResultType::TYPE_MISMATCH,
                              ("Type of pipeline output '" + output.name() + "' does not match type produced in pipeline input."));
            }
        }
        
        if (spec.isupdatable()) {
            for (int modelIdx = 0; modelIdx < nModels - 1; modelIdx++) {
                auto model = pipelineParams.models(modelIdx);
                if (model.isupdatable()) {
                    return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION,
                                  ("Only the last model in the pipeline can be updatable. Model at position '" + std::to_string(modelIdx) + "' is marked as updatable."));
                }
            }
            if (false == pipelineParams.models(nModels - 1).isupdatable()) {
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION,
                              ("Last model in an updatable pipeline model should be marked as updatable."));
            }
        } else {
            for (int modelIdx = 0; modelIdx < nModels; modelIdx++) {
                auto model = pipelineParams.models(modelIdx);
                if (model.isupdatable()) {
                    return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION,
                                  ("Found an updatable model at '" + std::to_string(modelIdx) + "' inside a non-updatable pipeline."));
                }
            }
        }

        const int nNames = pipelineParams.names_size();
        if (nNames > 0) {
            if (nNames != nModels) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              ("The number of pipeline model names '" + std::to_string(nNames) +
                               "' doesn't match the number of models '" + std::to_string(nModels) + "'"));
            }
            std::set<std::string> names;
            for (int modelIdx = 0; modelIdx < nNames; modelIdx++) {
                auto modelName = pipelineParams.names(modelIdx);
                if (names.find(modelName) != names.end()) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  ("Pipeline model name '" + modelName +
                                   "' at index '" +std::to_string(modelIdx) + " has already been used for previous models"));
                }
                names.insert(modelName);
            }

        }
        // if we get here, no input of any model caused a type mismatch with
        // any other prior model in the chain, or had an independent validation
        // error on its own.
        return Result();
    }